

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

int indexof(ctmbstr item,ctmbstr *list)

{
  int iVar1;
  ctmbstr s2;
  ulong uVar2;
  
  if ((list != (ctmbstr *)0x0) && (s2 = *list, s2 != (ctmbstr)0x0)) {
    uVar2 = 0;
    do {
      iVar1 = prvTidytmbstrcasecmp(item,s2);
      if (iVar1 == 0) {
        return (int)uVar2;
      }
      uVar2 = (ulong)((int)uVar2 + 1);
      s2 = list[uVar2];
    } while (s2 != (ctmbstr)0x0);
  }
  return -1;
}

Assistant:

static
int indexof( ctmbstr item, ctmbstr *list )
{
    if ( list )
    {
        uint i = 0;
        while ( list[i] != NULL ) {
            if ( TY_(tmbstrcasecmp)(item, list[i]) == 0 )
                return i;
            i++;
        }
    }

    return -1;
}